

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O1

bool __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessRWTextureStore
          (ConversionStream *this,iterator *Token,iterator *ScopeEnd,Uint32 ArrayDim)

{
  const_iterator __position;
  _List_node_base *p_Var1;
  const_iterator cVar2;
  const_iterator __position_00;
  iterator *piVar3;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> Args_1;
  ulong uVar4;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> Pos;
  uint uVar5;
  string err;
  undefined1 local_2c8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  _Alloc_hider local_2a0;
  size_type local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  size_t local_280;
  ConversionStream *local_278;
  iterator *local_270;
  const_iterator local_268;
  const_iterator local_260;
  uint local_254;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_250;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_230;
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_210;
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  size_type local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b0;
  size_type local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  String local_50;
  
  Pos._M_node = Token->_M_node;
  local_278 = this;
  local_270 = Token;
  if (ArrayDim == 0xffffffff) {
    Args_1._M_node = ScopeEnd->_M_node;
  }
  else {
    local_268._M_node._0_4_ = ArrayDim + 1;
    uVar5 = 0;
    local_260._M_node = (_List_node_base *)ScopeEnd;
    do {
      Pos._M_node = (Pos._M_node)->_M_next;
      if ((Pos._M_node == ScopeEnd->_M_node) || (*(int *)&Pos._M_node[1]._M_next != 0x137))
      goto LAB_0037f40a;
      local_2c8._0_8_ =
           (local_278->m_Tokens).
           super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
           ._M_impl._M_node.super__List_node_base._M_next;
      Args_1 = Parsing::FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                         ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)local_2c8,ScopeEnd,Pos
                         );
      if (local_270->_M_node == ScopeEnd->_M_node) {
        FormatString<char[48]>
                  ((string *)local_2c8,
                   (char (*) [48])"Unable to find matching closing square bracket.");
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_50,local_278,local_270,4);
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessRWTextureStore",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x7bc,(string *)local_2c8,(char (*) [2])0x83f885,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        ScopeEnd = (iterator *)local_260;
        if ((_List_node_base *)local_2c8._0_8_ != (_List_node_base *)(local_2c8 + 0x10)) {
          operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
          ScopeEnd = (iterator *)local_260;
        }
      }
      if (*(int *)&Args_1._M_node[1]._M_next != 0x138) {
        FormatString<char[26],char[60]>
                  ((string *)local_2c8,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"ClosingStapleToken->Type == TokenType::ClosingSquareBracket",
                   (char (*) [60])Args_1._M_node);
        DebugAssertionFailed
                  ((Char *)local_2c8._0_8_,"ProcessRWTextureStore",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x7c1);
        if ((_List_node_base *)local_2c8._0_8_ != (_List_node_base *)(local_2c8 + 0x10)) {
          operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
        }
      }
      if (uVar5 < ArrayDim) {
        Pos = Args_1;
      }
      uVar5 = uVar5 + 1;
    } while ((uint)local_268._M_node != uVar5);
  }
  piVar3 = local_270;
  __position._M_node = (Args_1._M_node)->_M_next;
  p_Var1 = ScopeEnd->_M_node;
  if ((__position._M_node == p_Var1) ||
     (__position_00._M_node = __position._M_node, *(int *)&__position._M_node[1]._M_next != 0x144))
  {
LAB_0037f40a:
    uVar4 = 0;
  }
  else {
    for (; (__position_00._M_node != p_Var1 && (*(int *)&__position_00._M_node[1]._M_next != 0x13e))
        ; __position_00._M_node = (__position_00._M_node)->_M_next) {
    }
    uVar4 = CONCAT71((int7)((ulong)p_Var1 >> 8),__position_00._M_node != p_Var1);
    if (__position_00._M_node != p_Var1) {
      local_254 = (uint)uVar4;
      cVar2._M_node = local_270->_M_node;
      local_260._M_node = Args_1._M_node;
      local_90 = &local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"imageStore","");
      std::__cxx11::string::string
                ((string *)&local_70,(char *)piVar3->_M_node[3]._M_prev,(allocator *)&local_50);
      local_2c8._8_8_ = &local_2b0;
      local_2c8._0_4_ = 0x13b;
      if (local_90 == &local_80) {
        local_2b0._8_8_ = local_80._8_8_;
      }
      else {
        local_2c8._8_8_ = local_90;
      }
      local_2b0._M_allocated_capacity._1_7_ = local_80._M_allocated_capacity._1_7_;
      local_2b0._M_local_buf[0] = local_80._M_local_buf[0];
      local_278 = (ConversionStream *)&local_278->m_Tokens;
      local_2a0._M_p = (pointer)&local_290;
      local_2c8._16_8_ = local_88;
      local_88 = 0;
      local_80._M_local_buf[0] = '\0';
      if (local_70 == &local_60) {
        local_290._8_8_ = local_60._8_8_;
      }
      else {
        local_2a0._M_p = (pointer)local_70;
      }
      local_290._M_allocated_capacity._1_7_ = local_60._M_allocated_capacity._1_7_;
      local_290._M_local_buf[0] = local_60._M_local_buf[0];
      local_298 = local_68;
      local_68 = 0;
      local_60._M_local_buf[0] = '\0';
      local_280 = 0xffffffffffffffff;
      local_90 = &local_80;
      local_70 = &local_60;
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      emplace<Diligent::Parsing::HLSLTokenInfo>
                ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  *)local_278,cVar2,(HLSLTokenInfo *)local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_p != &local_290) {
        operator_delete(local_2a0._M_p,local_290._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._8_8_ != &local_2b0) {
        operator_delete((void *)local_2c8._8_8_,local_2b0._M_allocated_capacity + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,CONCAT71(local_60._M_allocated_capacity._1_7_,
                                          local_60._M_local_buf[0]) + 1);
      }
      piVar3 = local_270;
      if (local_90 != &local_80) {
        operator_delete(local_90,CONCAT71(local_80._M_allocated_capacity._1_7_,
                                          local_80._M_local_buf[0]) + 1);
      }
      cVar2._M_node = piVar3->_M_node;
      local_b0 = &local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"(","");
      local_d0 = &local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
      local_2c8._0_4_ = 0x135;
      local_2c8._8_8_ = &local_2b0;
      if (local_b0 == &local_a0) {
        local_2b0._8_8_ = local_a0._8_8_;
      }
      else {
        local_2c8._8_8_ = local_b0;
      }
      local_2b0._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_;
      local_2b0._M_local_buf[0] = local_a0._M_local_buf[0];
      local_2c8._16_8_ = local_a8;
      local_a8 = 0;
      local_a0._M_local_buf[0] = '\0';
      local_2a0._M_p = (pointer)&local_290;
      if (local_d0 == &local_c0) {
        local_290._8_8_ = local_c0._8_8_;
      }
      else {
        local_2a0._M_p = (pointer)local_d0;
      }
      local_290._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
      local_290._M_local_buf[0] = local_c0._M_local_buf[0];
      local_298 = local_c8;
      local_c8 = 0;
      local_c0._M_local_buf[0] = '\0';
      local_280 = 0xffffffffffffffff;
      local_d0 = &local_c0;
      local_b0 = &local_a0;
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      emplace<Diligent::Parsing::HLSLTokenInfo>
                ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  *)local_278,cVar2,(HLSLTokenInfo *)local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_p != &local_290) {
        operator_delete(local_2a0._M_p,local_290._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._8_8_ != &local_2b0) {
        operator_delete((void *)local_2c8._8_8_,local_2b0._M_allocated_capacity + 1);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,CONCAT71(local_c0._M_allocated_capacity._1_7_,
                                          local_c0._M_local_buf[0]) + 1);
      }
      piVar3 = local_270;
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,CONCAT71(local_a0._M_allocated_capacity._1_7_,
                                          local_a0._M_local_buf[0]) + 1);
      }
      std::__cxx11::string::_M_replace
                ((ulong)&piVar3->_M_node[3]._M_prev,0,(char *)piVar3->_M_node[4]._M_next,0x90e58d);
      std::__cxx11::string::_M_replace
                ((ulong)&Pos._M_node[3]._M_prev,0,(char *)Pos._M_node[4]._M_next,0x8048f6);
      *(undefined4 *)&Pos._M_node[1]._M_next = 0x13f;
      std::__cxx11::string::_M_replace
                ((ulong)&Pos._M_node[1]._M_prev,0,(char *)Pos._M_node[2]._M_next,0x864abb);
      local_268._M_node = (Pos._M_node)->_M_next;
      local_f0 = &local_e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"_ToIvec","");
      local_110 = &local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110," ","");
      local_2c8._0_4_ = 0x13b;
      if (local_f0 == &local_e0) {
        local_2b0._8_8_ = local_e0._8_8_;
        local_2c8._8_8_ = &local_2b0;
      }
      else {
        local_2c8._8_8_ = local_f0;
      }
      local_2b0._M_allocated_capacity._1_7_ = local_e0._M_allocated_capacity._1_7_;
      local_2b0._M_local_buf[0] = local_e0._M_local_buf[0];
      local_2c8._16_8_ = local_e8;
      local_e8 = 0;
      local_e0._M_local_buf[0] = '\0';
      if (local_110 == &local_100) {
        local_290._8_8_ = local_100._8_8_;
        local_2a0._M_p = (pointer)&local_290;
      }
      else {
        local_2a0._M_p = (pointer)local_110;
      }
      local_290._M_allocated_capacity._1_7_ = local_100._M_allocated_capacity._1_7_;
      local_290._M_local_buf[0] = local_100._M_local_buf[0];
      local_298 = local_108;
      local_108 = 0;
      local_100._M_local_buf[0] = '\0';
      local_280 = 0xffffffffffffffff;
      local_110 = &local_100;
      local_f0 = &local_e0;
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      emplace<Diligent::Parsing::HLSLTokenInfo>
                ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  *)local_278,local_268,(HLSLTokenInfo *)local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_p != &local_290) {
        operator_delete(local_2a0._M_p,local_290._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._8_8_ != &local_2b0) {
        operator_delete((void *)local_2c8._8_8_,local_2b0._M_allocated_capacity + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,
                        CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]) +
                        1);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,CONCAT71(local_e0._M_allocated_capacity._1_7_,
                                          local_e0._M_local_buf[0]) + 1);
      }
      local_130 = &local_120;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"(","");
      local_150 = &local_140;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"");
      local_2c8._0_4_ = 0x135;
      if (local_130 == &local_120) {
        local_2b0._8_8_ = local_120._8_8_;
        local_2c8._8_8_ = &local_2b0;
      }
      else {
        local_2c8._8_8_ = local_130;
      }
      local_2b0._M_allocated_capacity._1_7_ = local_120._M_allocated_capacity._1_7_;
      local_2b0._M_local_buf[0] = local_120._M_local_buf[0];
      local_2c8._16_8_ = local_128;
      local_128 = 0;
      local_120._M_local_buf[0] = '\0';
      if (local_150 == &local_140) {
        local_290._8_8_ = local_140._8_8_;
        local_2a0._M_p = (pointer)&local_290;
      }
      else {
        local_2a0._M_p = (pointer)local_150;
      }
      local_290._M_allocated_capacity._1_7_ = local_140._M_allocated_capacity._1_7_;
      local_290._M_local_buf[0] = local_140._M_local_buf[0];
      local_298 = local_148;
      local_148 = 0;
      local_140._M_local_buf[0] = '\0';
      local_280 = 0xffffffffffffffff;
      local_150 = &local_140;
      local_130 = &local_120;
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      emplace<Diligent::Parsing::HLSLTokenInfo>
                ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  *)local_278,local_268,(HLSLTokenInfo *)local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_p != &local_290) {
        operator_delete(local_2a0._M_p,local_290._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._8_8_ != &local_2b0) {
        operator_delete((void *)local_2c8._8_8_,local_2b0._M_allocated_capacity + 1);
      }
      if (local_150 != &local_140) {
        operator_delete(local_150,
                        CONCAT71(local_140._M_allocated_capacity._1_7_,local_140._M_local_buf[0]) +
                        1);
      }
      if (local_130 != &local_120) {
        operator_delete(local_130,
                        CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0]) +
                        1);
      }
      local_170 = &local_160;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,")","");
      local_190 = &local_180;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"");
      local_2c8._0_4_ = 0x136;
      if (local_170 == &local_160) {
        local_2b0._8_8_ = local_160._8_8_;
        local_2c8._8_8_ = &local_2b0;
      }
      else {
        local_2c8._8_8_ = local_170;
      }
      local_2b0._M_allocated_capacity._1_7_ = local_160._M_allocated_capacity._1_7_;
      local_2b0._M_local_buf[0] = local_160._M_local_buf[0];
      local_2c8._16_8_ = local_168;
      local_168 = 0;
      local_160._M_local_buf[0] = '\0';
      if (local_190 == &local_180) {
        local_290._8_8_ = local_180._8_8_;
        local_2a0._M_p = (pointer)&local_290;
      }
      else {
        local_2a0._M_p = (pointer)local_190;
      }
      local_290._M_allocated_capacity._1_7_ = local_180._M_allocated_capacity._1_7_;
      local_290._M_local_buf[0] = local_180._M_local_buf[0];
      local_298 = local_188;
      local_188 = 0;
      local_180._M_local_buf[0] = '\0';
      local_280 = 0xffffffffffffffff;
      local_190 = &local_180;
      local_170 = &local_160;
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      emplace<Diligent::Parsing::HLSLTokenInfo>
                ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  *)local_278,local_260,(HLSLTokenInfo *)local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_p != &local_290) {
        operator_delete(local_2a0._M_p,local_290._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._8_8_ != &local_2b0) {
        operator_delete((void *)local_2c8._8_8_,local_2b0._M_allocated_capacity + 1);
      }
      if (local_190 != &local_180) {
        operator_delete(local_190,
                        CONCAT71(local_180._M_allocated_capacity._1_7_,local_180._M_local_buf[0]) +
                        1);
      }
      if (local_170 != &local_160) {
        operator_delete(local_170,
                        CONCAT71(local_160._M_allocated_capacity._1_7_,local_160._M_local_buf[0]) +
                        1);
      }
      cVar2._M_node = local_260._M_node;
      std::__cxx11::string::_M_replace
                ((ulong)&local_260._M_node[3]._M_prev,0,(char *)local_260._M_node[4]._M_next,
                 0x8048f6);
      *(undefined4 *)&cVar2._M_node[1]._M_next = 0x13f;
      std::__cxx11::string::_M_replace
                ((ulong)&cVar2._M_node[1]._M_prev,0,(char *)cVar2._M_node[2]._M_next,0x864abb);
      std::__cxx11::string::_M_replace
                ((ulong)&__position._M_node[3]._M_prev,0,(char *)__position._M_node[4]._M_next,
                 0x8048f6);
      *(undefined4 *)&__position._M_node[1]._M_next = 0x135;
      std::__cxx11::string::_M_replace
                ((ulong)&__position._M_node[1]._M_prev,0,(char *)__position._M_node[2]._M_next,
                 0x82e2c3);
      local_1b0 = &local_1a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"_ExpandVector","");
      local_1d0 = &local_1c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0," ","");
      local_2c8._0_4_ = 0x13b;
      if (local_1b0 == &local_1a0) {
        local_2b0._8_8_ = local_1a0._8_8_;
        local_2c8._8_8_ = &local_2b0;
      }
      else {
        local_2c8._8_8_ = local_1b0;
      }
      local_2b0._M_allocated_capacity._1_7_ = local_1a0._M_allocated_capacity._1_7_;
      local_2b0._M_local_buf[0] = local_1a0._M_local_buf[0];
      local_2c8._16_8_ = local_1a8;
      local_1a8 = 0;
      local_1a0._M_local_buf[0] = '\0';
      if (local_1d0 == &local_1c0) {
        local_290._8_8_ = local_1c0._8_8_;
        local_2a0._M_p = (pointer)&local_290;
      }
      else {
        local_2a0._M_p = (pointer)local_1d0;
      }
      local_290._M_allocated_capacity._1_7_ = local_1c0._M_allocated_capacity._1_7_;
      local_290._M_local_buf[0] = local_1c0._M_local_buf[0];
      local_298 = local_1c8;
      local_1c8 = 0;
      local_1c0._M_local_buf[0] = '\0';
      local_280 = 0xffffffffffffffff;
      local_1d0 = &local_1c0;
      local_1b0 = &local_1a0;
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      emplace<Diligent::Parsing::HLSLTokenInfo>
                ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  *)local_278,__position,(HLSLTokenInfo *)local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_p != &local_290) {
        operator_delete(local_2a0._M_p,local_290._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._8_8_ != &local_2b0) {
        operator_delete((void *)local_2c8._8_8_,local_2b0._M_allocated_capacity + 1);
      }
      if (local_1d0 != &local_1c0) {
        operator_delete(local_1d0,
                        CONCAT71(local_1c0._M_allocated_capacity._1_7_,local_1c0._M_local_buf[0]) +
                        1);
      }
      if (local_1b0 != &local_1a0) {
        operator_delete(local_1b0,
                        CONCAT71(local_1a0._M_allocated_capacity._1_7_,local_1a0._M_local_buf[0]) +
                        1);
      }
      local_1f0 = &local_1e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,")","");
      local_210 = &local_200;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
      local_2c8._0_4_ = 0x136;
      if (local_1f0 == &local_1e0) {
        local_2b0._8_8_ = local_1e0._8_8_;
        local_2c8._8_8_ = &local_2b0;
      }
      else {
        local_2c8._8_8_ = local_1f0;
      }
      local_2b0._M_allocated_capacity._1_7_ = local_1e0._M_allocated_capacity._1_7_;
      local_2b0._M_local_buf[0] = local_1e0._M_local_buf[0];
      local_2c8._16_8_ = local_1e8;
      local_1e8 = 0;
      local_1e0._M_local_buf[0] = '\0';
      if (local_210 == &local_200) {
        local_290._8_8_ = local_200._8_8_;
        local_2a0._M_p = (pointer)&local_290;
      }
      else {
        local_2a0._M_p = (pointer)local_210;
      }
      local_290._M_allocated_capacity._1_7_ = local_200._M_allocated_capacity._1_7_;
      local_290._M_local_buf[0] = local_200._M_local_buf[0];
      local_298 = local_208;
      local_208 = 0;
      local_200._M_local_buf[0] = '\0';
      local_280 = 0xffffffffffffffff;
      local_210 = &local_200;
      local_1f0 = &local_1e0;
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      emplace<Diligent::Parsing::HLSLTokenInfo>
                ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  *)local_278,__position_00,(HLSLTokenInfo *)local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_p != &local_290) {
        operator_delete(local_2a0._M_p,local_290._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._8_8_ != &local_2b0) {
        operator_delete((void *)local_2c8._8_8_,local_2b0._M_allocated_capacity + 1);
      }
      if (local_210 != &local_200) {
        operator_delete(local_210,
                        CONCAT71(local_200._M_allocated_capacity._1_7_,local_200._M_local_buf[0]) +
                        1);
      }
      if (local_1f0 != &local_1e0) {
        operator_delete(local_1f0,
                        CONCAT71(local_1e0._M_allocated_capacity._1_7_,local_1e0._M_local_buf[0]) +
                        1);
      }
      local_230 = &local_220;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,")","");
      local_250 = &local_240;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"");
      local_2c8._0_4_ = 0x136;
      if (local_230 == &local_220) {
        local_2b0._8_8_ = local_220._8_8_;
        local_2c8._8_8_ = &local_2b0;
      }
      else {
        local_2c8._8_8_ = local_230;
      }
      local_2b0._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
      local_2b0._M_local_buf[0] = local_220._M_local_buf[0];
      local_2c8._16_8_ = local_228;
      local_228 = 0;
      local_220._M_local_buf[0] = '\0';
      if (local_250 == &local_240) {
        local_290._8_8_ = local_240._8_8_;
        local_2a0._M_p = (pointer)&local_290;
      }
      else {
        local_2a0._M_p = (pointer)local_250;
      }
      local_290._M_allocated_capacity._1_7_ = local_240._M_allocated_capacity._1_7_;
      local_290._M_local_buf[0] = local_240._M_local_buf[0];
      local_298 = local_248;
      local_248 = 0;
      local_240._M_local_buf[0] = '\0';
      local_280 = 0xffffffffffffffff;
      local_250 = &local_240;
      local_230 = &local_220;
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      emplace<Diligent::Parsing::HLSLTokenInfo>
                ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  *)local_278,__position_00,(HLSLTokenInfo *)local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_p != &local_290) {
        operator_delete(local_2a0._M_p,local_290._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._8_8_ != &local_2b0) {
        operator_delete((void *)local_2c8._8_8_,local_2b0._M_allocated_capacity + 1);
      }
      if (local_250 != &local_240) {
        operator_delete(local_250,
                        CONCAT71(local_240._M_allocated_capacity._1_7_,local_240._M_local_buf[0]) +
                        1);
      }
      piVar3 = local_270;
      if (local_230 != &local_220) {
        operator_delete(local_230,
                        CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) +
                        1);
      }
      piVar3->_M_node = local_268._M_node;
      uVar4 = (ulong)local_254;
    }
  }
  return SUB81(uVar4,0);
}

Assistant:

bool HLSL2GLSLConverterImpl::ConversionStream::ProcessRWTextureStore(TokenListType::iterator&       Token,
                                                                     const TokenListType::iterator& ScopeEnd,
                                                                     Uint32                         ArrayDim)
{
    // RWTex[Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    // ^

    // Find the last pair of square brackets, skipping texture array indexing
    auto OpenStapleToken    = Token;
    auto ClosingStapleToken = ScopeEnd;
    for (Uint32 ArrayIdx = 0; ArrayIdx < ArrayDim + 1; ++ArrayIdx)
    {
        ++OpenStapleToken;
        if (OpenStapleToken == ScopeEnd || OpenStapleToken->Type != TokenType::OpenSquareBracket)
            return false;

        ClosingStapleToken = Parsing::FindMatchingBracket(m_Tokens.begin(), ScopeEnd, OpenStapleToken);
        VERIFY_PARSER_STATE(Token, Token != ScopeEnd, "Unable to find matching closing square bracket.");

        // RWTex[Location[idx].xy]
        //                       ^
        //              ClosingStapleToken
        VERIFY_EXPR(ClosingStapleToken->Type == TokenType::ClosingSquareBracket);

        if (ArrayIdx < ArrayDim)
        {
            OpenStapleToken = ClosingStapleToken;
            // RWTexArray[idx[0]][Location.xy]
            //                  ^
            //            OpenStapleToken
        }
    }
    //      RWTex[Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    //           ^           ^
    //  OpenStaplePos     ClosingStaplePos

    auto AssignmentToken = ClosingStapleToken;
    ++AssignmentToken;

    if (AssignmentToken == ScopeEnd || AssignmentToken->Type != TokenType::Assignment)
    {
        // The function is called for ALL RW texture objects found, so this may not be
        // the store operation, but something else (for instance:
        // InterlockedExchange(Tex2D_I1[GTid.xy], 1, iOldVal) )
        return false;
    }

    // RWTex[Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    //                    ^
    //              AssignmentToken

    auto SemicolonToken = AssignmentToken;
    while (SemicolonToken != ScopeEnd && SemicolonToken->Type != TokenType::Semicolon)
        ++SemicolonToken;
    if (SemicolonToken == ScopeEnd)
        return false;
    // RWTex[Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    // ^                                              ^
    // Token                                    SemicolonToken

    m_Tokens.insert(Token, TokenInfo(TokenType::Identifier, "imageStore", Token->Delimiter.c_str()));
    m_Tokens.insert(Token, TokenInfo(TokenType::OpenParen, "(", ""));
    Token->Delimiter = " ";
    // imageStore( RWTex[Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    //             ^    ^
    //          Token  OpenStapleToken

    OpenStapleToken->Delimiter = "";
    OpenStapleToken->Type      = TokenType::Comma;
    OpenStapleToken->Literal   = ",";
    // imageStore( RWTex,Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    //                  ^           ^
    //      OpenStapleToken     ClosingStapleToken

    auto LocationToken = OpenStapleToken;
    ++LocationToken;
    m_Tokens.insert(LocationToken, TokenInfo(TokenType::Identifier, "_ToIvec", " "));
    m_Tokens.insert(LocationToken, TokenInfo(TokenType::OpenParen, "(", ""));
    // imageStore( RWTex, _ToIvec(Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    //                            ^          ^
    //                  LocationToken     ClosingStapleToken

    m_Tokens.insert(ClosingStapleToken, TokenInfo(TokenType::ClosingParen, ")", ""));
    // imageStore( RWTex, _ToIvec(Location.xy)] = float4(0.0, 0.0, 0.0, 1.0);
    //                                        ^
    //                                ClosingStapleToken

    ClosingStapleToken->Delimiter = "";
    ClosingStapleToken->Type      = TokenType::Comma;
    ClosingStapleToken->Literal   = ",";
    // imageStore( RWTex, _ToIvec(Location.xy), = float4(0.0, 0.0, 0.0, 1.0);
    //                                          ^
    //                                   AssignmentToken

    AssignmentToken->Delimiter = "";
    AssignmentToken->Type      = TokenType::OpenParen;
    AssignmentToken->Literal   = "(";
    // imageStore( RWTex, _ToIvec(Location.xy),( float4(0.0, 0.0, 0.0, 1.0);
    //                                         ^
    //                                   AssignmentToken

    m_Tokens.insert(AssignmentToken, TokenInfo(TokenType::Identifier, "_ExpandVector", " "));
    // imageStore( RWTex, _ToIvec(Location.xy), _ExpandVector( float4(0.0, 0.0, 0.0, 1.0);
    //                                                       ^                           ^
    //                                                AssignmentToken               SemicolonToken

    // Insert closing bracket for _ExpandVector
    m_Tokens.insert(SemicolonToken, TokenInfo(TokenType::ClosingParen, ")", ""));
    // imageStore( RWTex,  _ToIvec(Location.xy), _ExpandVector( float4(0.0, 0.0, 0.0, 1.0));
    //                                                                                     ^
    //                                                                              SemicolonToken

    // Insert closing bracket for imageStore
    m_Tokens.insert(SemicolonToken, TokenInfo(TokenType::ClosingParen, ")", ""));
    // imageStore( RWTex,  _ToIvec(Location.xy), _ExpandVector( float4(0.0, 0.0, 0.0, 1.0)));
    //                                                                                      ^
    //                                                                               SemicolonToken

    Token = LocationToken;
    // imageStore( RWTex,  _ToIvec(Location.xy), _ExpandVector( float4(0.0, 0.0, 0.0, 1.0)));
    //                             ^

    // Note that 'Location' may require further processing as it itself may be e.g. image load operation

    return true;
}